

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull.c
# Opt level: O2

void pull0_sock_init(void *arg,nni_sock *sock)

{
  nni_aio_list_init((nni_list *)((long)arg + 0x20));
  nni_list_init_offset((nni_list *)((long)arg + 8),0x1e8);
  nni_mtx_init((nni_mtx *)((long)arg + 0x38));
  nni_pollable_init((nni_pollable *)((long)arg + 0x60));
  return;
}

Assistant:

static void
pull0_sock_init(void *arg, nni_sock *sock)
{
	pull0_sock *s = arg;
	NNI_ARG_UNUSED(sock);

	nni_aio_list_init(&s->rq);
	NNI_LIST_INIT(&s->pl, pull0_pipe, node);
	nni_mtx_init(&s->m);
	nni_pollable_init(&s->readable);
}